

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDataflow_cpp.h
# Opt level: O2

u32 __thiscall
moira::Moira::readM<(moira::MemSpace)1,(moira::Size)4,96ul>(Moira *this,u32 addr,bool *error)

{
  u32 uVar1;
  AEStackFrame frame;
  
  *error = SUB41(addr & 1,0);
  if ((addr & 1) == 0) {
    uVar1 = readM<(moira::MemSpace)1,(moira::Size)4,96ul>(this,addr);
    return uVar1;
  }
  this->fcl = '\x01';
  frame = makeFrame<96ul>(this,addr);
  execAddressError(this,frame,2);
  return 0;
}

Assistant:

u32
Moira::readM(u32 addr, bool &error)
{
    // Check for address errors
    if ((error = misaligned<S>(addr))) {
        setFC(M == MEM_DATA ? FC_USER_DATA : FC_USER_PROG);
        execAddressError(makeFrame<F>(addr), 2);
        return 0;
    }
    
    return readM<M,S,F>(addr);
}